

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void testing::Cardinality::DescribeActualCallCountTo(int actual_call_count,ostream *os)

{
  int n;
  string local_38;
  
  if (0 < actual_call_count) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"called ",7);
    (anonymous_namespace)::FormatTimes_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)(ulong)(uint)actual_call_count,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"never called",0xc);
  return;
}

Assistant:

void Cardinality::DescribeActualCallCountTo(int actual_call_count,
                                            ::std::ostream* os) {
  if (actual_call_count > 0) {
    *os << "called " << FormatTimes(actual_call_count);
  } else {
    *os << "never called";
  }
}